

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UDateTimePatternConflict __thiscall
icu_63::DateTimePatternGenerator::addPatternWithSkeleton
          (DateTimePatternGenerator *this,UnicodeString *pattern,UnicodeString *skeletonToUse,
          UBool override,UnicodeString *conflictingPattern,UErrorCode *status)

{
  UBool UVar1;
  PtnSkeleton *local_1d8;
  PtnSkeleton *entrySpecifiedSkeleton;
  UnicodeString *local_1c8;
  UnicodeString *duplicatePattern;
  undefined1 local_1b8 [7];
  UBool entryHadSpecifiedSkeleton;
  DateTimeMatcher matcher;
  UDateTimePatternConflict conflictingStatus;
  undefined1 local_110 [8];
  PtnSkeleton skeleton;
  UnicodeString basePattern;
  UErrorCode *status_local;
  UnicodeString *conflictingPattern_local;
  UBool override_local;
  UnicodeString *skeletonToUse_local;
  UnicodeString *pattern_local;
  DateTimePatternGenerator *this_local;
  
  UVar1 = ::U_FAILURE(this->internalErrorCode);
  if (UVar1 != '\0') {
    *status = this->internalErrorCode;
    return UDATPG_NO_CONFLICT;
  }
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&skeleton.addedDefaultDayPeriod);
  PtnSkeleton::PtnSkeleton((PtnSkeleton *)local_110);
  matcher.skeleton.addedDefaultDayPeriod = '\0';
  matcher.skeleton._137_3_ = 0;
  DateTimeMatcher::DateTimeMatcher((DateTimeMatcher *)local_1b8);
  if (skeletonToUse == (UnicodeString *)0x0) {
    DateTimeMatcher::set((DateTimeMatcher *)local_1b8,pattern,this->fp,(PtnSkeleton *)local_110);
    DateTimeMatcher::getBasePattern
              ((DateTimeMatcher *)local_1b8,(UnicodeString *)&skeleton.addedDefaultDayPeriod);
  }
  else {
    DateTimeMatcher::set
              ((DateTimeMatcher *)local_1b8,skeletonToUse,this->fp,(PtnSkeleton *)local_110);
    DateTimeMatcher::getBasePattern
              ((DateTimeMatcher *)local_1b8,(UnicodeString *)&skeleton.addedDefaultDayPeriod);
  }
  local_1c8 = PatternMap::getPatternFromBasePattern
                        (this->patternMap,(UnicodeString *)&skeleton.addedDefaultDayPeriod,
                         (UBool *)((long)&duplicatePattern + 7));
  if ((local_1c8 != (UnicodeString *)0x0) &&
     ((duplicatePattern._7_1_ == '\0' ||
      ((skeletonToUse != (UnicodeString *)0x0 && (override == '\0')))))) {
    matcher.skeleton.addedDefaultDayPeriod = '\x01';
    matcher.skeleton._137_3_ = 0;
    icu_63::UnicodeString::operator=(conflictingPattern,local_1c8);
    if (override == '\0') {
      this_local._4_4_ = matcher.skeleton._136_4_;
      goto LAB_003ab7a2;
    }
  }
  local_1d8 = (PtnSkeleton *)0x0;
  local_1c8 = PatternMap::getPatternFromSkeleton
                        (this->patternMap,(PtnSkeleton *)local_110,&local_1d8);
  if (local_1c8 != (UnicodeString *)0x0) {
    matcher.skeleton.addedDefaultDayPeriod = '\x02';
    matcher.skeleton._137_3_ = 0;
    icu_63::UnicodeString::operator=(conflictingPattern,local_1c8);
    if ((override == '\0') ||
       ((skeletonToUse != (UnicodeString *)0x0 && (local_1d8 != (PtnSkeleton *)0x0)))) {
      this_local._4_4_ = matcher.skeleton._136_4_;
      goto LAB_003ab7a2;
    }
  }
  PatternMap::add(this->patternMap,(UnicodeString *)&skeleton.addedDefaultDayPeriod,
                  (PtnSkeleton *)local_110,pattern,skeletonToUse != (UnicodeString *)0x0,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_local._4_4_ = UDATPG_NO_CONFLICT;
  }
  else {
    this_local._4_4_ = matcher.skeleton._136_4_;
  }
LAB_003ab7a2:
  entrySpecifiedSkeleton._4_4_ = 1;
  DateTimeMatcher::~DateTimeMatcher((DateTimeMatcher *)local_1b8);
  PtnSkeleton::~PtnSkeleton((PtnSkeleton *)local_110);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&skeleton.addedDefaultDayPeriod);
  return this_local._4_4_;
}

Assistant:

UDateTimePatternConflict
DateTimePatternGenerator::addPatternWithSkeleton(
    const UnicodeString& pattern,
    const UnicodeString* skeletonToUse,
    UBool override,
    UnicodeString& conflictingPattern,
    UErrorCode& status)
{
    if (U_FAILURE(internalErrorCode)) {
        status = internalErrorCode;
        return UDATPG_NO_CONFLICT;
    }

    UnicodeString basePattern;
    PtnSkeleton   skeleton;
    UDateTimePatternConflict conflictingStatus = UDATPG_NO_CONFLICT;

    DateTimeMatcher matcher;
    if ( skeletonToUse == nullptr ) {
        matcher.set(pattern, fp, skeleton);
        matcher.getBasePattern(basePattern);
    } else {
        matcher.set(*skeletonToUse, fp, skeleton); // no longer trims skeleton fields to max len 3, per #7930
        matcher.getBasePattern(basePattern); // or perhaps instead: basePattern = *skeletonToUse;
    }
    // We only care about base conflicts - and replacing the pattern associated with a base - if:
    // 1. the conflicting previous base pattern did *not* have an explicit skeleton; in that case the previous
    // base + pattern combination was derived from either (a) a canonical item, (b) a standard format, or
    // (c) a pattern specified programmatically with a previous call to addPattern (which would only happen
    // if we are getting here from a subsequent call to addPattern).
    // 2. a skeleton is specified for the current pattern, but override=false; in that case we are checking
    // availableFormats items from root, which should not override any previous entry with the same base.
    UBool entryHadSpecifiedSkeleton;
    const UnicodeString *duplicatePattern = patternMap->getPatternFromBasePattern(basePattern, entryHadSpecifiedSkeleton);
    if (duplicatePattern != nullptr && (!entryHadSpecifiedSkeleton || (skeletonToUse != nullptr && !override))) {
        conflictingStatus = UDATPG_BASE_CONFLICT;
        conflictingPattern = *duplicatePattern;
        if (!override) {
            return conflictingStatus;
        }
    }
    // The only time we get here with override=true and skeletonToUse!=null is when adding availableFormats
    // items from CLDR data. In that case, we don't want an item from a parent locale to replace an item with
    // same skeleton from the specified locale, so skip the current item if skeletonWasSpecified is true for
    // the previously-specified conflicting item.
    const PtnSkeleton* entrySpecifiedSkeleton = nullptr;
    duplicatePattern = patternMap->getPatternFromSkeleton(skeleton, &entrySpecifiedSkeleton);
    if (duplicatePattern != nullptr ) {
        conflictingStatus = UDATPG_CONFLICT;
        conflictingPattern = *duplicatePattern;
        if (!override || (skeletonToUse != nullptr && entrySpecifiedSkeleton != nullptr)) {
            return conflictingStatus;
        }
    }
    patternMap->add(basePattern, skeleton, pattern, skeletonToUse != nullptr, status);
    if(U_FAILURE(status)) {
        return conflictingStatus;
    }

    return UDATPG_NO_CONFLICT;
}